

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O2

mraa_gpio_context mraa_gpio_chardev_init(int *pins,int num_pins)

{
  _gpio_group *p_Var1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  mraa_boolean_t mVar5;
  mraa_result_t mVar6;
  mraa_gpio_context dev;
  int *piVar7;
  _gpio_group *p_Var8;
  mraa_pininfo_t *pmVar9;
  mraa_gpiod_chip_info *__ptr;
  uint *puVar10;
  void *pvVar11;
  int i;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  mraa_board_t *pmVar15;
  mraa_pin_t *pmVar16;
  char *pcVar17;
  undefined1 *puVar18;
  size_t __size;
  byte bVar19;
  mraa_pin_t in_stack_fffffffffffffee8;
  int local_98 [26];
  
  pmVar15 = plat;
  bVar19 = 0;
  dev = (mraa_gpio_context)calloc(1,0x88);
  if (dev == (mraa_gpio_context)0x0) {
    syslog(2,"[GPIOD_INTERFACE]: Failed to allocate memory for context");
    return (mraa_gpio_context)0x0;
  }
  piVar7 = (int *)malloc((long)num_pins << 2);
  dev->pin_to_gpio_table = piVar7;
  if (piVar7 != (int *)0x0) {
    uVar4 = mraa_get_number_of_gpio_chips();
    dev->num_chips = uVar4;
    if (uVar4 == 0) goto LAB_0010a5f6;
    dev->num_pins = num_pins;
    p_Var8 = (_gpio_group *)calloc((ulong)uVar4,0x40);
    if (p_Var8 != (_gpio_group *)0x0) {
      dev->gpio_group = p_Var8;
      puVar10 = &p_Var8->gpio_chip;
      for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
        *puVar10 = (uint)uVar12;
        *(uint **)(puVar10 + 3) = (uint *)0x0;
        puVar10 = puVar10 + 0x10;
      }
      if (num_pins < 1) {
        num_pins = 0;
      }
      for (uVar12 = 0; (uint)num_pins != uVar12; uVar12 = uVar12 + 1) {
        mVar5 = mraa_is_sub_platform_id(pins[uVar12]);
        uVar4 = pins[uVar12];
        if (mVar5 != 0) {
          syslog(5,"[GPIOD_INTERFACE]: init: Using sub platform for %d");
          pmVar15 = pmVar15->sub_platform;
          uVar14 = (ulong)(uint)pins[uVar12];
          if (pmVar15 != (mraa_board_t *)0x0) {
            uVar4 = mraa_get_sub_platform_index(pins[uVar12]);
            pins[uVar12] = uVar4;
            goto LAB_0010a37a;
          }
          pcVar17 = "[GPIOD_INTERFACE]: init: Sub platform not initialised for pin %d";
LAB_0010a53c:
          syslog(3,pcVar17,uVar14);
          goto LAB_0010a5f6;
        }
LAB_0010a37a:
        uVar14 = (ulong)uVar4;
        if (((int)uVar4 < 0) || (pmVar15->phy_pin_count <= (int)uVar4)) {
          syslog(3,"[GPIOD_INTERFACE]: init: pin %d beyond platform pin count (%d)");
          goto LAB_0010a5f6;
        }
        pmVar9 = pmVar15->pins;
        if (((uint)pmVar9[uVar14].capabilities & 2) == 0) {
          pcVar17 = "[GPIOD_INTERFACE]: init: pin %d not capable of gpio";
          goto LAB_0010a53c;
        }
        if (pmVar9[uVar14].gpio.mux_total != 0) {
          pmVar16 = &pmVar9[uVar14].gpio;
          piVar7 = local_98;
          for (lVar13 = 0x19; lVar13 != 0; lVar13 = lVar13 + -1) {
            *piVar7 = pmVar16->pinmap;
            pmVar16 = (mraa_pin_t *)((long)pmVar16 + (ulong)bVar19 * -8 + 4);
            piVar7 = piVar7 + (ulong)bVar19 * -2 + 1;
          }
          piVar7 = local_98;
          puVar18 = &stack0xfffffffffffffee8;
          for (lVar13 = 100; lVar13 != 0; lVar13 = lVar13 + -1) {
            *puVar18 = (char)*piVar7;
            piVar7 = (int *)((long)piVar7 + (ulong)bVar19 * -2 + 1);
            puVar18 = puVar18 + (ulong)bVar19 * -2 + 1;
          }
          mVar6 = mraa_setup_mux_mapped(in_stack_fffffffffffffee8);
          if (mVar6 != MRAA_SUCCESS) {
            uVar14 = (ulong)(uint)pins[uVar12];
            pcVar17 = "[GPIOD_INTERFACE]: init: unable to setup muxes for pin %d";
            goto LAB_0010a53c;
          }
          pmVar9 = pmVar15->pins;
          uVar4 = pins[uVar12];
        }
        uVar2 = pmVar9[(int)uVar4].gpio.gpio_chip;
        uVar4 = pmVar9[(int)uVar4].gpio.gpio_line;
        dev->pin_to_gpio_table[uVar12] = uVar2;
        p_Var1 = p_Var8 + (int)uVar2;
        if (p_Var8[(int)uVar2].is_required == 0) {
          __ptr = mraa_get_chip_info_by_number(uVar2);
          if (__ptr == (mraa_gpiod_chip_info *)0x0) {
            pcVar17 = "[GPIOD_INTERFACE]: error getting gpio_chip_info for chip %d";
            uVar14 = (ulong)uVar2;
            goto LAB_0010a53c;
          }
          p_Var1->dev_fd = __ptr->chip_fd;
          p_Var1->is_required = 1;
          p_Var1->gpiod_handle = -1;
          free(__ptr);
        }
        uVar2 = p_Var1->num_gpio_lines;
        puVar10 = (uint *)realloc(p_Var1->gpio_lines,(long)(int)uVar2 * 4 + 4);
        p_Var1->gpio_lines = puVar10;
        if (puVar10 == (uint *)0x0) goto LAB_0010a4f6;
        puVar10[(int)uVar2] = uVar4;
        p_Var1->num_gpio_lines = p_Var1->num_gpio_lines + 1;
      }
      uVar4 = dev->num_chips;
      for (lVar13 = 0; (ulong)uVar4 << 6 != lVar13; lVar13 = lVar13 + 0x40) {
        uVar12 = (ulong)*(uint *)((long)&p_Var8->num_gpio_lines + lVar13);
        pvVar11 = calloc(uVar12,1);
        *(void **)((long)&p_Var8->rw_values + lVar13) = pvVar11;
        if (pvVar11 == (void *)0x0) goto LAB_0010a4f6;
        pvVar11 = calloc(uVar12,4);
        *(void **)((long)&p_Var8->gpio_group_to_pins_table + lVar13) = pvVar11;
        if (pvVar11 == (void *)0x0) goto LAB_0010a4f6;
        *(undefined8 *)((long)&p_Var8->event_handles + lVar13) = 0;
      }
      pvVar11 = calloc((ulong)uVar4,4);
      if (pvVar11 == (void *)0x0) {
        pcVar17 = "[GPIOD_INTERFACE]: Failed to allocate memory for local variable";
        goto LAB_0010a4fd;
      }
      for (uVar12 = 0; (uint)num_pins != uVar12; uVar12 = uVar12 + 1) {
        lVar13 = (long)dev->pin_to_gpio_table[uVar12];
        iVar3 = *(int *)((long)pvVar11 + lVar13 * 4);
        p_Var8[lVar13].gpio_group_to_pins_table[iVar3] = (uint)uVar12;
        *(int *)((long)pvVar11 + lVar13 * 4) = iVar3 + 1;
      }
      free(pvVar11);
      __size = (ulong)dev->num_pins << 2;
      piVar7 = (int *)malloc(__size);
      dev->provided_pins = piVar7;
      if (piVar7 != (int *)0x0) {
        memcpy(piVar7,pins,__size);
        dev->events = (mraa_gpio_events_t)0x0;
        return dev;
      }
    }
  }
  syslog(2,"[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
LAB_0010a5f6:
  mraa_gpio_close(dev);
  return (mraa_gpio_context)0x0;
LAB_0010a4f6:
  pcVar17 = "[GPIOD_INTERFACE]: Failed to allocate memory for internal member";
LAB_0010a4fd:
  syslog(2,pcVar17);
  goto LAB_0010a5f6;
}

Assistant:

mraa_gpio_context
mraa_gpio_chardev_init(int pins[], int num_pins)
{
    int chip_id, line_offset;
    mraa_gpio_context dev;
    mraa_gpiod_group_t gpio_group;

    mraa_board_t* board = plat;

    dev = (mraa_gpio_context) calloc(1, sizeof(struct _gpio));
    if (dev == NULL) {
        syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for context");
        return NULL;
    }

    dev->pin_to_gpio_table = malloc(num_pins * sizeof(int));
    if (dev->pin_to_gpio_table == NULL) {
        syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
        mraa_gpio_close(dev);
        return NULL;
    }

    dev->num_chips = mraa_get_number_of_gpio_chips();
    if (dev->num_chips <= 0) {
        mraa_gpio_close(dev);
        return NULL;
    }

    dev->num_pins = num_pins;

    gpio_group = calloc(dev->num_chips, sizeof(struct _gpio_group));
    if (gpio_group == NULL) {
        syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
        mraa_gpio_close(dev);
        return NULL;
    }

    dev->gpio_group = gpio_group;

    for (int i = 0; i < dev->num_chips; ++i) {
        gpio_group[i].gpio_chip = i;
        /* Just to be sure realloc has the desired behaviour. */
        gpio_group[i].gpio_lines = NULL;
    }

    for (int i = 0; i < num_pins; ++i) {
        if (mraa_is_sub_platform_id(pins[i])) {
            syslog(LOG_NOTICE, "[GPIOD_INTERFACE]: init: Using sub platform for %d", pins[i]);
            board = board->sub_platform;
            if (board == NULL) {
                syslog(LOG_ERR, "[GPIOD_INTERFACE]: init: Sub platform not initialised for pin %d", pins[i]);
                mraa_gpio_close(dev);
                return NULL;
            }
            pins[i] = mraa_get_sub_platform_index(pins[i]);
        }

        if (pins[i] < 0 || pins[i] >= board->phy_pin_count) {
            syslog(LOG_ERR, "[GPIOD_INTERFACE]: init: pin %d beyond platform pin count (%d)",
                   pins[i], board->phy_pin_count);
            mraa_gpio_close(dev);
            return NULL;
        }

        if (board->pins[pins[i]].capabilities.gpio != 1) {
            syslog(LOG_ERR, "[GPIOD_INTERFACE]: init: pin %d not capable of gpio", pins[i]);
            mraa_gpio_close(dev);
            return NULL;
        }

        if (board->pins[pins[i]].gpio.mux_total > 0) {
            if (mraa_setup_mux_mapped(board->pins[pins[i]].gpio) != MRAA_SUCCESS) {
                syslog(LOG_ERR, "[GPIOD_INTERFACE]: init: unable to setup muxes for pin %d", pins[i]);
                mraa_gpio_close(dev);
                return NULL;
            }
        }

        chip_id = board->pins[pins[i]].gpio.gpio_chip;
        line_offset = board->pins[pins[i]].gpio.gpio_line;

        /* Map pin to _gpio_group structure. */
        dev->pin_to_gpio_table[i] = chip_id;

        if (!gpio_group[chip_id].is_required) {
            mraa_gpiod_chip_info* cinfo = mraa_get_chip_info_by_number(chip_id);
            if (!cinfo) {
                syslog(LOG_ERR, "[GPIOD_INTERFACE]: error getting gpio_chip_info for chip %d", chip_id);
                mraa_gpio_close(dev);
                return NULL;
            }

            gpio_group[chip_id].dev_fd = cinfo->chip_fd;
            gpio_group[chip_id].is_required = 1;
            gpio_group[chip_id].gpiod_handle = -1;

            free(cinfo);
        }

        int line_in_group;
        line_in_group = gpio_group[chip_id].num_gpio_lines;
        gpio_group[chip_id].gpio_lines =
        realloc(gpio_group[chip_id].gpio_lines, (line_in_group + 1) * sizeof(unsigned int));
        if (gpio_group[chip_id].gpio_lines == NULL) {
            syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
            mraa_gpio_close(dev);
            return NULL;
        }

        gpio_group[chip_id].gpio_lines[line_in_group] = line_offset;
        gpio_group[chip_id].num_gpio_lines++;
    }

    /* Initialize rw_values for read / write multiple functions.
     * Also, allocate memory for inverse map: */
    for (int i = 0; i < dev->num_chips; ++i) {
        gpio_group[i].rw_values = calloc(gpio_group[i].num_gpio_lines, sizeof(unsigned char));
        if (gpio_group[i].rw_values == NULL) {
            syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
            mraa_gpio_close(dev);
            return NULL;
        }

        gpio_group[i].gpio_group_to_pins_table = calloc(gpio_group[i].num_gpio_lines, sizeof(int));
        if (gpio_group[i].gpio_group_to_pins_table == NULL) {
            syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
            mraa_gpio_close(dev);
            return NULL;
        }

        /* Set event handle arrays for all lines contained on a chip to NULL. */
        gpio_group[i].event_handles = NULL;
    }

    /* Finally map the inverse relation between a gpio group and its original pin numbers
     * provided by user. */
    int* counters = calloc(dev->num_chips, sizeof(int));
    if (counters == NULL) {
        syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for local variable");
        mraa_gpio_close(dev);
        return NULL;
    }

    for (int i = 0; i < num_pins; ++i) {
        int chip = dev->pin_to_gpio_table[i];
        gpio_group[chip].gpio_group_to_pins_table[counters[chip]] = i;
        counters[chip]++;
    }
    free(counters);

    /* Save the provided array from the user to our internal structure. */
    dev->provided_pins = malloc(dev->num_pins * sizeof(int));
    if (dev->provided_pins == NULL) {
        syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
        mraa_gpio_close(dev);
        return NULL;
    }

    memcpy(dev->provided_pins, pins, dev->num_pins * sizeof(int));

    /* Initialize events array. */
    dev->events = NULL;

    return dev;
}